

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::moveImmToStackArg
          (RACFGBuilder *this,InvokeNode *invokeNode,FuncValue *arg,Imm *imm_)

{
  ushort uVar1;
  char cVar2;
  undefined1 auVar3 [12];
  uint uVar4;
  Error EVar5;
  undefined8 extraout_RAX;
  uint uVar6;
  long lVar7;
  Operand_ *o1;
  Signature SVar8;
  Operand_ local_58;
  undefined1 local_48 [8];
  uint uStack_40;
  uint32_t uStack_3c;
  undefined1 local_38 [16];
  
  uVar4 = arg->_data;
  if ((uVar4 >> 9 & 1) == 0) {
    moveImmToStackArg();
    __clang_call_terminate(extraout_RAX);
  }
  uVar6 = *(uint *)(*(long *)this + 0x1d8) & 0xf8;
  local_58._data[1] = (int)uVar4 >> 0xc;
  local_58._baseId = *(uint32_t *)(*(long *)this + 0x1dc);
  local_58._data[0] = 0;
  local_38._0_12_ = ZEXT812(4);
  local_58._signature._bits = uVar6 + 0x4000002;
  _local_48 = (imm_->super_Operand).super_Operand_;
  auVar3 = _local_48;
  EVar5 = 0x19;
  SVar8 = local_48._0_4_;
  uVar1 = local_48._8_2_;
  switch(uVar4 & 0xff) {
  case 0x22:
    cVar2 = local_48[8];
    local_48._0_4_ = SVar8._bits & 0xfffffff7;
    uVar4 = (uint)cVar2;
    break;
  case 0x23:
    uVar4 = local_48._8_4_ & 0xff;
    goto LAB_001482d8;
  case 0x24:
    local_48._0_4_ = SVar8._bits & 0xfffffff7;
    uVar4 = (uint)(short)uVar1;
    break;
  case 0x25:
    uVar4 = (uint)uVar1;
LAB_001482d8:
    local_48._0_4_ = SVar8._bits & 0xfffffff7;
    break;
  case 0x26:
  case 0x27:
  case 0x2a:
    goto switchD_00148238_caseD_26;
  case 0x28:
  case 0x29:
  case 0x2b:
  case 0x31:
  case 0x32:
    if (((this[0x291] == (RACFGBuilder)0x1) &&
        (((undefined1  [16])_local_48 & (undefined1  [16])0x8) == (undefined1  [16])0x0)) &&
       ((uint32_t  [2])(long)(int)local_48._8_4_ == local_48._8_8_)) {
      local_58._signature._bits = uVar6 | 0x8000002;
      goto LAB_001482ef;
    }
    local_38._8_4_ = local_48._12_4_;
    local_38._0_8_ = 4;
    uStack_3c = 0;
    _local_48 = (Operand_)CONCAT412(uStack_3c,auVar3);
    lVar7 = 2;
    goto LAB_001482f5;
  default:
    goto switchD_00148238_caseD_2c;
  }
  uStack_40 = uVar4;
  auVar3 = _local_48;
switchD_00148238_caseD_26:
  _local_48 = auVar3;
  uStack_3c = 0;
LAB_001482ef:
  lVar7 = 1;
LAB_001482f5:
  local_38._12_4_ = 0;
  o1 = (Operand_ *)local_48;
  do {
    EVar5 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),0x1b7,&local_58,o1);
    if (EVar5 != 0) {
      return EVar5;
    }
    local_58._data[1] = local_58._data[1] + (local_58._signature._bits >> 0x18);
    o1 = o1 + 1;
    lVar7 = lVar7 + -1;
  } while (lVar7 != 0);
  EVar5 = 0;
switchD_00148238_caseD_2c:
  return EVar5;
}

Assistant:

Error RACFGBuilder::moveImmToStackArg(InvokeNode* invokeNode, const FuncValue& arg, const Imm& imm_) noexcept {
  DebugUtils::unused(invokeNode);
  ASMJIT_ASSERT(arg.isStack());

  Mem stackPtr = ptr(_pass->_sp.as<Gp>(), arg.stackOffset());
  Imm imm[2];

  stackPtr.setSize(4);
  imm[0] = imm_;
  uint32_t movCount = 0;

  // One stack entry has the same size as the native register size. That means that if we want to move a 32-bit
  // integer on the stack in 64-bit mode, we need to extend it to a 64-bit integer first. In 32-bit mode, pushing
  // a 64-bit on stack is done in two steps by pushing low and high parts separately.
  switch (arg.typeId()) {
    case TypeId::kInt8: imm[0].signExtend8Bits(); goto MovU32;
    case TypeId::kUInt8: imm[0].zeroExtend8Bits(); goto MovU32;
    case TypeId::kInt16: imm[0].signExtend16Bits(); goto MovU32;
    case TypeId::kUInt16: imm[0].zeroExtend16Bits(); goto MovU32;

    case TypeId::kInt32:
    case TypeId::kUInt32:
    case TypeId::kFloat32:
MovU32:
      imm[0].zeroExtend32Bits();
      movCount = 1;
      break;

    case TypeId::kInt64:
    case TypeId::kUInt64:
    case TypeId::kFloat64:
    case TypeId::kMmx32:
    case TypeId::kMmx64:
      if (_is64Bit && imm[0].isInt32()) {
        stackPtr.setSize(8);
        movCount = 1;
        break;
      }

      imm[1].setValue(imm[0].uint32Hi());
      imm[0].zeroExtend32Bits();
      movCount = 2;
      break;

    default:
      return DebugUtils::errored(kErrorInvalidAssignment);
  }

  for (uint32_t i = 0; i < movCount; i++) {
    ASMJIT_PROPAGATE(cc()->mov(stackPtr, imm[i]));
    stackPtr.addOffsetLo32(int32_t(stackPtr.size()));
  }

  return kErrorOk;
}